

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O1

void decode_nvrm_ioctl_host_unmap(nvrm_ioctl_host_unmap *s)

{
  char *pcVar1;
  FILE *__stream;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  fprintf(_stdout,"%ssubdev: 0x%08x",nvrm_pfx,(ulong)s->subdev);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->subdev,"subdev");
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sfoffset: 0x%016lx",nvrm_sep,s->foffset);
  __stream = _stdout;
  pcVar1 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_host_unmap(struct nvrm_ioctl_host_unmap *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, subdev, cid);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_x64(s, foffset);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}